

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cstr_test.c
# Opt level: O0

void itoa_test(zt_unit_test *test,void *data)

{
  int iVar1;
  int iVar2;
  ssize_t sVar3;
  zt_unit_test *in_RDI;
  char *msg_24;
  char *msg_23;
  char *msg_22;
  char *msg_21;
  char *msg_20;
  char *msg_19;
  char *msg_18;
  char *msg_17;
  char *msg_16;
  char *msg_15;
  char *msg_14;
  char *msg_13;
  char *msg_12;
  char *msg_11;
  char *msg_10;
  char *msg_9;
  char *msg_8;
  char *msg_7;
  char *msg_6;
  char *msg_5;
  char *msg_4;
  char *msg_3;
  char *msg_2;
  char *msg_1;
  char *msg;
  char buffer [100];
  int i;
  size_t in_stack_fffffffffffffed0;
  size_t in_stack_fffffffffffffed8;
  undefined8 in_stack_fffffffffffffee0;
  char *in_stack_fffffffffffffee8;
  int local_14;
  
  iVar2 = (int)((ulong)in_stack_fffffffffffffee0 >> 0x20);
  memset(&stack0xffffffffffffff88,0,100);
  sVar3 = zt_cstr_itoa(in_stack_fffffffffffffee8,iVar2,in_stack_fffffffffffffed8,
                       in_stack_fffffffffffffed0);
  if (sVar3 != -1) {
    iVar2 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_cstr_itoa(NULL, 0, 0, 100) == -1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x15e);
    if (iVar2 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  sVar3 = zt_cstr_itoa(in_stack_fffffffffffffee8,iVar2,in_stack_fffffffffffffed8,
                       in_stack_fffffffffffffed0);
  if (sVar3 != -1) {
    iVar2 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_cstr_itoa(buffer, 0, 0, 0) == -1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x15f);
    if (iVar2 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  sVar3 = zt_cstr_itoa(in_stack_fffffffffffffee8,iVar2,in_stack_fffffffffffffed8,
                       in_stack_fffffffffffffed0);
  if (sVar3 != -1) {
    iVar2 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_cstr_itoa(buffer, 10, 5, 6) == -1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x160);
    if (iVar2 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  sVar3 = zt_cstr_itoa(in_stack_fffffffffffffee8,iVar2,in_stack_fffffffffffffed8,
                       in_stack_fffffffffffffed0);
  if (sVar3 != 1) {
    iVar2 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_cstr_itoa(buffer, 0, 0, 100) == 1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x163);
    if (iVar2 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  iVar1 = strcmp("0",&stack0xffffffffffffff88);
  if (iVar1 != 0) {
    iVar2 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","strcmp(\"0\", buffer) == 0",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x164);
    if (iVar2 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  sVar3 = zt_cstr_itoa(in_stack_fffffffffffffee8,iVar2,in_stack_fffffffffffffed8,
                       in_stack_fffffffffffffed0);
  if (sVar3 != 1) {
    iVar2 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_cstr_itoa(buffer, 3, 0, 100) == 1",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x166);
    if (iVar2 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  iVar1 = strcmp("3",&stack0xffffffffffffff88);
  if (iVar1 != 0) {
    iVar2 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","strcmp(\"3\", buffer) == 0",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x167);
    if (iVar2 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  sVar3 = zt_cstr_itoa(in_stack_fffffffffffffee8,iVar2,in_stack_fffffffffffffed8,
                       in_stack_fffffffffffffed0);
  if (sVar3 != 2) {
    iVar2 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_cstr_itoa(buffer, 10, 0, 100) == 2",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x169);
    if (iVar2 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  iVar1 = strcmp("10",&stack0xffffffffffffff88);
  if (iVar1 != 0) {
    iVar2 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","strcmp(\"10\", buffer) == 0",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x16a);
    if (iVar2 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  sVar3 = zt_cstr_itoa(in_stack_fffffffffffffee8,iVar2,in_stack_fffffffffffffed8,
                       in_stack_fffffffffffffed0);
  if (sVar3 != 2) {
    iVar2 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_cstr_itoa(buffer, 42, 0, 100) == 2",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x16c);
    if (iVar2 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  iVar1 = strcmp("42",&stack0xffffffffffffff88);
  if (iVar1 != 0) {
    iVar2 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","strcmp(\"42\", buffer) == 0",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x16d);
    if (iVar2 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  sVar3 = zt_cstr_itoa(in_stack_fffffffffffffee8,iVar2,in_stack_fffffffffffffed8,
                       in_stack_fffffffffffffed0);
  if (sVar3 != 9) {
    iVar2 = zt_unit_printf(&in_RDI->error,"%s : %s:%d",
                           "zt_cstr_itoa(buffer, 987654321, 0, 100) == 9",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x16f);
    if (iVar2 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  iVar1 = strcmp("987654321",&stack0xffffffffffffff88);
  if (iVar1 != 0) {
    iVar2 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","strcmp(\"987654321\", buffer) == 0",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x170);
    if (iVar2 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  sVar3 = zt_cstr_itoa(in_stack_fffffffffffffee8,iVar2,in_stack_fffffffffffffed8,
                       in_stack_fffffffffffffed0);
  if (sVar3 != 2) {
    iVar2 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_cstr_itoa(buffer, -3, 0, 100) == 2",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x172);
    if (iVar2 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  iVar1 = strcmp("-3",&stack0xffffffffffffff88);
  if (iVar1 != 0) {
    iVar2 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","strcmp(\"-3\", buffer) == 0",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x173);
    if (iVar2 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  zt_unit_test_add_assertion(in_RDI);
  sVar3 = zt_cstr_itoa(in_stack_fffffffffffffee8,iVar2,in_stack_fffffffffffffed8,
                       in_stack_fffffffffffffed0);
  if (sVar3 == 3) {
    zt_unit_test_add_assertion(in_RDI);
    iVar1 = strcmp("-10",&stack0xffffffffffffff88);
    if (iVar1 != 0) {
      iVar2 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","strcmp(\"-10\", buffer) == 0",
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                             ,0x176);
      if (iVar2 == 0) {
        in_RDI->error = (char *)0x0;
      }
      longjmp((__jmp_buf_tag *)in_RDI->env,1);
    }
    zt_unit_test_add_assertion(in_RDI);
    sVar3 = zt_cstr_itoa(in_stack_fffffffffffffee8,iVar2,in_stack_fffffffffffffed8,
                         in_stack_fffffffffffffed0);
    if (sVar3 != 3) {
      iVar2 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_cstr_itoa(buffer, -42, 0, 100) == 3",
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                             ,0x178);
      if (iVar2 == 0) {
        in_RDI->error = (char *)0x0;
      }
      longjmp((__jmp_buf_tag *)in_RDI->env,1);
    }
    zt_unit_test_add_assertion(in_RDI);
    iVar1 = strcmp("-42",&stack0xffffffffffffff88);
    if (iVar1 != 0) {
      iVar2 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","strcmp(\"-42\", buffer) == 0",
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                             ,0x179);
      if (iVar2 == 0) {
        in_RDI->error = (char *)0x0;
      }
      longjmp((__jmp_buf_tag *)in_RDI->env,1);
    }
    zt_unit_test_add_assertion(in_RDI);
    sVar3 = zt_cstr_itoa(in_stack_fffffffffffffee8,iVar2,in_stack_fffffffffffffed8,
                         in_stack_fffffffffffffed0);
    if (sVar3 != 10) {
      iVar2 = zt_unit_printf(&in_RDI->error,"%s : %s:%d",
                             "zt_cstr_itoa(buffer, -987654321, 0, 100) == 10",
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                             ,0x17b);
      if (iVar2 == 0) {
        in_RDI->error = (char *)0x0;
      }
      longjmp((__jmp_buf_tag *)in_RDI->env,1);
    }
    zt_unit_test_add_assertion(in_RDI);
    iVar1 = strcmp("-987654321",&stack0xffffffffffffff88);
    if (iVar1 != 0) {
      iVar2 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","strcmp(\"-987654321\", buffer) == 0",
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                             ,0x17c);
      if (iVar2 == 0) {
        in_RDI->error = (char *)0x0;
      }
      longjmp((__jmp_buf_tag *)in_RDI->env,1);
    }
    zt_unit_test_add_assertion(in_RDI);
    for (local_14 = 0; local_14 < 0x14; local_14 = local_14 + 1) {
      (&stack0xffffffffffffff88)[local_14] = 0x61;
    }
    sVar3 = zt_cstr_itoa(in_stack_fffffffffffffee8,iVar2,in_stack_fffffffffffffed8,
                         in_stack_fffffffffffffed0);
    if (sVar3 != 6) {
      iVar2 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_cstr_itoa(buffer, 301, 3, 100) == 6",
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                             ,0x183);
      if (iVar2 == 0) {
        in_RDI->error = (char *)0x0;
      }
      longjmp((__jmp_buf_tag *)in_RDI->env,1);
    }
    zt_unit_test_add_assertion(in_RDI);
    iVar1 = strcmp("aaa301",&stack0xffffffffffffff88);
    if (iVar1 != 0) {
      iVar2 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","strcmp(\"aaa301\", buffer) == 0",
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                             ,0x184);
      if (iVar2 == 0) {
        in_RDI->error = (char *)0x0;
      }
      longjmp((__jmp_buf_tag *)in_RDI->env,1);
    }
    zt_unit_test_add_assertion(in_RDI);
    for (local_14 = 0; local_14 < 0x14; local_14 = local_14 + 1) {
      (&stack0xffffffffffffff88)[local_14] = 0x61;
    }
    sVar3 = zt_cstr_itoa(in_stack_fffffffffffffee8,iVar2,in_stack_fffffffffffffed8,
                         in_stack_fffffffffffffed0);
    if (sVar3 == 9) {
      zt_unit_test_add_assertion(in_RDI);
      iVar2 = strcmp("aaaa-5920",&stack0xffffffffffffff88);
      if (iVar2 == 0) {
        zt_unit_test_add_assertion(in_RDI);
        return;
      }
      iVar2 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","strcmp(\"aaaa-5920\", buffer) == 0",
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                             ,0x18b);
      if (iVar2 == 0) {
        in_RDI->error = (char *)0x0;
      }
      longjmp((__jmp_buf_tag *)in_RDI->env,1);
    }
    iVar2 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_cstr_itoa(buffer, -5920, 4, 100) == 9",
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                           ,0x18a);
    if (iVar2 == 0) {
      in_RDI->error = (char *)0x0;
    }
    longjmp((__jmp_buf_tag *)in_RDI->env,1);
  }
  iVar2 = zt_unit_printf(&in_RDI->error,"%s : %s:%d","zt_cstr_itoa(buffer, -10, 0, 100) == 3",
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/zerotao[P]libzt/tests/cstr_test.c"
                         ,0x175);
  if (iVar2 == 0) {
    in_RDI->error = (char *)0x0;
  }
  longjmp((__jmp_buf_tag *)in_RDI->env,1);
}

Assistant:

static void itoa_test(struct zt_unit_test *test, void *data UNUSED) {
  int i;
  char buffer[100];

  memset(buffer, 0, 100);

  /* Illegal input validation. */
  ZT_UNIT_ASSERT(test, zt_cstr_itoa(NULL, 0, 0, 100) == -1);
  ZT_UNIT_ASSERT(test, zt_cstr_itoa(buffer, 0, 0, 0) == -1);
  ZT_UNIT_ASSERT(test, zt_cstr_itoa(buffer, 10, 5, 6) == -1);

  /* Valid inputs */
  ZT_UNIT_ASSERT(test, zt_cstr_itoa(buffer, 0, 0, 100) == 1);
  ZT_UNIT_ASSERT(test, strcmp("0", buffer) == 0);

  ZT_UNIT_ASSERT(test, zt_cstr_itoa(buffer, 3, 0, 100) == 1);
  ZT_UNIT_ASSERT(test, strcmp("3", buffer) == 0);

  ZT_UNIT_ASSERT(test, zt_cstr_itoa(buffer, 10, 0, 100) == 2);
  ZT_UNIT_ASSERT(test, strcmp("10", buffer) == 0);

  ZT_UNIT_ASSERT(test, zt_cstr_itoa(buffer, 42, 0, 100) == 2);
  ZT_UNIT_ASSERT(test, strcmp("42", buffer) == 0);

  ZT_UNIT_ASSERT(test, zt_cstr_itoa(buffer, 987654321, 0, 100) == 9);
  ZT_UNIT_ASSERT(test, strcmp("987654321", buffer) == 0);

  ZT_UNIT_ASSERT(test, zt_cstr_itoa(buffer, -3, 0, 100) == 2);
  ZT_UNIT_ASSERT(test, strcmp("-3", buffer) == 0);

  ZT_UNIT_ASSERT(test, zt_cstr_itoa(buffer, -10, 0, 100) == 3);
  ZT_UNIT_ASSERT(test, strcmp("-10", buffer) == 0);

  ZT_UNIT_ASSERT(test, zt_cstr_itoa(buffer, -42, 0, 100) == 3);
  ZT_UNIT_ASSERT(test, strcmp("-42", buffer) == 0);

  ZT_UNIT_ASSERT(test, zt_cstr_itoa(buffer, -987654321, 0, 100) == 10);
  ZT_UNIT_ASSERT(test, strcmp("-987654321", buffer) == 0);

  /* offset */
  for (i = 0; i < 20; i++) {
    buffer[i] = 'a';
  }

  ZT_UNIT_ASSERT(test, zt_cstr_itoa(buffer, 301, 3, 100) == 6);
  ZT_UNIT_ASSERT(test, strcmp("aaa301", buffer) == 0);

  for (i = 0; i < 20; i++) {
    buffer[i] = 'a';
  }

  ZT_UNIT_ASSERT(test, zt_cstr_itoa(buffer, -5920, 4, 100) == 9);
  ZT_UNIT_ASSERT(test, strcmp("aaaa-5920", buffer) == 0);
}